

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_jnt_convolve_sse4.c
# Opt level: O3

void av1_highbd_dist_wtd_convolve_x_sse4_1
               (uint16_t *src,int src_stride,uint16_t *dst0,int dst_stride0,int w,int h,
               InterpFilterParams *filter_params_x,int subpel_x_qn,ConvolveParams *conv_params,
               int bd)

{
  int16_t *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  char cVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  int iVar24;
  uint uVar25;
  uint uVar26;
  uint16_t *puVar27;
  int iVar28;
  undefined1 (*pauVar29) [16];
  undefined1 (*pauVar30) [16];
  int iVar31;
  undefined1 (*pauVar32) [16];
  ulong uVar33;
  uint uVar34;
  ulong uVar35;
  undefined1 (*pauVar36) [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  int iVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  short sVar45;
  int iVar46;
  short sVar51;
  int iVar52;
  short sVar54;
  int iVar55;
  short sVar56;
  short sVar57;
  undefined1 auVar47 [16];
  int iVar58;
  undefined1 auVar48 [16];
  short sVar50;
  short sVar53;
  undefined1 auVar49 [16];
  short sVar59;
  int iVar60;
  int iVar64;
  int iVar65;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  int iVar66;
  undefined1 auVar63 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  short local_48;
  short sStack_46;
  
  iVar31 = conv_params->round_0 + conv_params->round_1;
  cVar15 = (char)bd - (char)iVar31;
  uVar25 = 0xff;
  if (bd == 0xc) {
    uVar25 = 0xfff;
  }
  uVar34 = 0x3ff;
  if (bd != 10) {
    uVar34 = uVar25;
  }
  if (0 < w) {
    iVar24 = 7 - conv_params->round_1;
    uVar26 = (1 << (cVar15 + 0xdU & 0x1f)) + (1 << (cVar15 + 0xeU & 0x1f));
    uVar25 = 0xe - iVar31;
    pauVar30 = (undefined1 (*) [16])conv_params->dst;
    iVar31 = conv_params->fwd_offset;
    iVar2 = conv_params->bck_offset;
    iVar42 = (1 << ((byte)conv_params->round_0 & 0x1f)) >> 1;
    auVar43 = ZEXT416((uint)conv_params->round_0);
    auVar37 = pshuflw(ZEXT416(uVar26),ZEXT416(uVar34),0);
    piVar1 = filter_params_x->filter_ptr + (subpel_x_qn & 0xfU) * (uint)filter_params_x->taps;
    uVar16 = *(undefined4 *)piVar1;
    uVar17 = *(undefined4 *)(piVar1 + 2);
    uVar18 = *(undefined4 *)(piVar1 + 4);
    uVar19 = *(undefined4 *)(piVar1 + 6);
    iVar3 = conv_params->dst_stride;
    iVar4 = conv_params->do_average;
    iVar5 = conv_params->use_dist_wtd_comp_avg;
    iVar28 = ((1 << ((byte)uVar25 & 0x1f)) >> 1) - uVar26;
    pauVar36 = (undefined1 (*) [16])
               ((long)src + (0x12 - (ulong)((uint)(filter_params_x->taps >> 1) * 2)));
    uVar33 = 0;
    do {
      puVar27 = dst0;
      pauVar29 = pauVar36;
      pauVar32 = pauVar30;
      uVar35 = (ulong)(uint)h;
      if (0 < h) {
        do {
          auVar41 = pauVar29[-1];
          auVar44 = *pauVar29;
          auVar6._16_16_ = auVar44;
          auVar6._0_16_ = auVar41;
          auVar7._16_16_ = auVar44;
          auVar7._0_16_ = auVar41;
          auVar8._16_16_ = auVar44;
          auVar8._0_16_ = auVar41;
          auVar61._4_4_ = uVar18;
          auVar61._0_4_ = uVar18;
          auVar61._8_4_ = uVar18;
          auVar61._12_4_ = uVar18;
          auVar67 = pmaddwd(auVar7._8_16_,auVar61);
          auVar68._4_4_ = uVar19;
          auVar68._0_4_ = uVar19;
          auVar68._8_4_ = uVar19;
          auVar68._12_4_ = uVar19;
          auVar38 = pmaddwd(auVar8._12_16_,auVar68);
          auVar39._0_4_ = auVar38._0_4_ + auVar67._0_4_;
          auVar39._4_4_ = auVar38._4_4_ + auVar67._4_4_;
          auVar39._8_4_ = auVar38._8_4_ + auVar67._8_4_;
          auVar39._12_4_ = auVar38._12_4_ + auVar67._12_4_;
          auVar9._16_16_ = auVar44;
          auVar9._0_16_ = auVar41;
          auVar10._16_16_ = auVar44;
          auVar10._0_16_ = auVar41;
          auVar11._16_16_ = auVar44;
          auVar11._0_16_ = auVar41;
          auVar12._16_16_ = auVar44;
          auVar12._0_16_ = auVar41;
          auVar44._4_4_ = uVar16;
          auVar44._0_4_ = uVar16;
          auVar44._8_4_ = uVar16;
          auVar44._12_4_ = uVar16;
          auVar61 = pmaddwd(auVar41,auVar44);
          auVar38._4_4_ = uVar17;
          auVar38._0_4_ = uVar17;
          auVar38._8_4_ = uVar17;
          auVar38._12_4_ = uVar17;
          auVar44 = pmaddwd(auVar6._4_16_,auVar38);
          auVar41._4_4_ = uVar16;
          auVar41._0_4_ = uVar16;
          auVar41._8_4_ = uVar16;
          auVar41._12_4_ = uVar16;
          auVar68 = pmaddwd(auVar9._2_16_,auVar41);
          auVar67._4_4_ = uVar17;
          auVar67._0_4_ = uVar17;
          auVar67._8_4_ = uVar17;
          auVar67._12_4_ = uVar17;
          auVar41 = pmaddwd(auVar10._6_16_,auVar67);
          auVar13._4_4_ = uVar18;
          auVar13._0_4_ = uVar18;
          auVar13._8_4_ = uVar18;
          auVar13._12_4_ = uVar18;
          auVar67 = pmaddwd(auVar11._10_16_,auVar13);
          auVar14._4_4_ = uVar19;
          auVar14._0_4_ = uVar19;
          auVar14._8_4_ = uVar19;
          auVar14._12_4_ = uVar19;
          auVar38 = pmaddwd(auVar12._14_16_,auVar14);
          auVar47._0_4_ =
               ((auVar61._0_4_ + iVar42 + auVar44._0_4_ + auVar39._0_4_ >> auVar43) << iVar24) +
               uVar26;
          auVar47._4_4_ =
               ((auVar68._0_4_ + iVar42 + auVar67._0_4_ + auVar41._0_4_ + auVar38._0_4_ >> auVar43)
               << iVar24) + uVar26;
          auVar47._8_4_ =
               (auVar61._4_4_ + iVar42 + auVar44._4_4_ + auVar39._4_4_ >> auVar43) + uVar26;
          auVar47._12_4_ =
               (auVar68._4_4_ + iVar42 + auVar67._4_4_ + auVar41._4_4_ + auVar38._4_4_ >> auVar43) +
               uVar26;
          local_48 = auVar37._0_2_;
          sStack_46 = auVar37._2_2_;
          if ((long)((ulong)(uint)w - 8) < (long)uVar33) {
            if (iVar4 == 0) {
              auVar41 = packusdw(auVar47,auVar47);
              *(long *)*pauVar32 = auVar41._0_8_;
            }
            else {
              auVar41 = pmovzxwd(auVar39,*(undefined8 *)*pauVar32);
              if (iVar5 == 0) {
                iVar46 = auVar47._0_4_ + auVar41._0_4_ >> 1;
                iVar52 = auVar47._4_4_ + auVar41._4_4_ >> 1;
                iVar55 = auVar47._8_4_ + auVar41._8_4_ >> 1;
                iVar58 = auVar47._12_4_ + auVar41._12_4_ >> 1;
              }
              else {
                auVar22._4_4_ = iVar31;
                auVar22._0_4_ = iVar31;
                auVar22._8_4_ = iVar31;
                auVar22._12_4_ = iVar31;
                auVar41 = pmulld(auVar41,auVar22);
                auVar20._4_4_ = iVar2;
                auVar20._0_4_ = iVar2;
                auVar20._8_4_ = iVar2;
                auVar20._12_4_ = iVar2;
                auVar44 = pmulld(auVar47,auVar20);
                iVar46 = auVar44._0_4_ + auVar41._0_4_ >> 4;
                iVar52 = auVar44._4_4_ + auVar41._4_4_ >> 4;
                iVar55 = auVar44._8_4_ + auVar41._8_4_ >> 4;
                iVar58 = auVar44._12_4_ + auVar41._12_4_ >> 4;
              }
              auVar41 = ZEXT416(uVar25);
              auVar48._0_4_ = iVar46 + iVar28 >> auVar41;
              auVar48._4_4_ = iVar52 + iVar28 >> auVar41;
              auVar48._8_4_ = iVar55 + iVar28 >> auVar41;
              auVar48._12_4_ = iVar58 + iVar28 >> auVar41;
              auVar41 = packusdw(auVar48,auVar48);
              sVar45 = auVar41._0_2_;
              sVar50 = auVar41._2_2_;
              sVar51 = auVar41._4_2_;
              sVar53 = auVar41._6_2_;
              *(ulong *)puVar27 =
                   CONCAT26((ushort)(sStack_46 < sVar53) * sStack_46 |
                            (ushort)(sStack_46 >= sVar53) * sVar53,
                            CONCAT24((ushort)(local_48 < sVar51) * local_48 |
                                     (ushort)(local_48 >= sVar51) * sVar51,
                                     CONCAT22((ushort)(sStack_46 < sVar50) * sStack_46 |
                                              (ushort)(sStack_46 >= sVar50) * sVar50,
                                              (ushort)(local_48 < sVar45) * local_48 |
                                              (ushort)(local_48 >= sVar45) * sVar45)));
            }
          }
          else {
            auVar62._0_4_ =
                 (auVar61._8_4_ + iVar42 + auVar44._8_4_ + auVar39._8_4_ >> auVar43) + uVar26;
            auVar62._4_4_ =
                 (auVar68._8_4_ + iVar42 + auVar67._8_4_ + auVar41._8_4_ + auVar38._8_4_ >> auVar43)
                 + uVar26;
            auVar62._8_4_ =
                 (auVar61._12_4_ + iVar42 + auVar44._12_4_ + auVar39._12_4_ >> auVar43) + uVar26;
            auVar62._12_4_ =
                 (auVar68._12_4_ + iVar42 + auVar67._12_4_ + auVar41._12_4_ + auVar38._12_4_ >>
                 auVar43) + uVar26;
            if (iVar4 == 0) {
              auVar41 = packusdw(auVar47,auVar62);
              *pauVar32 = auVar41;
            }
            else {
              auVar41 = *pauVar32;
              auVar44 = pmovzxwd(auVar38,auVar41);
              auVar40._0_4_ = CONCAT22(0,auVar41._8_2_);
              auVar40._4_2_ = auVar41._10_2_;
              auVar40._6_2_ = 0;
              auVar40._8_2_ = auVar41._12_2_;
              auVar40._10_2_ = 0;
              auVar40._12_2_ = auVar41._14_2_;
              auVar40._14_2_ = 0;
              if (iVar5 == 0) {
                iVar46 = auVar47._0_4_ + auVar44._0_4_ >> 1;
                iVar52 = auVar47._4_4_ + auVar44._4_4_ >> 1;
                iVar55 = auVar47._8_4_ + auVar44._8_4_ >> 1;
                iVar58 = auVar47._12_4_ + auVar44._12_4_ >> 1;
                iVar60 = (int)(auVar62._0_4_ + auVar40._0_4_) >> 1;
                iVar64 = (int)(auVar62._4_4_ + (uint)auVar41._10_2_) >> 1;
                iVar65 = (int)(auVar62._8_4_ + (uint)auVar41._12_2_) >> 1;
                iVar66 = (int)(auVar62._12_4_ + (uint)auVar41._14_2_) >> 1;
              }
              else {
                auVar23._4_4_ = iVar31;
                auVar23._0_4_ = iVar31;
                auVar23._8_4_ = iVar31;
                auVar23._12_4_ = iVar31;
                auVar41 = pmulld(auVar44,auVar23);
                auVar21._4_4_ = iVar2;
                auVar21._0_4_ = iVar2;
                auVar21._8_4_ = iVar2;
                auVar21._12_4_ = iVar2;
                auVar44 = pmulld(auVar47,auVar21);
                iVar46 = auVar44._0_4_ + auVar41._0_4_ >> 4;
                iVar52 = auVar44._4_4_ + auVar41._4_4_ >> 4;
                iVar55 = auVar44._8_4_ + auVar41._8_4_ >> 4;
                iVar58 = auVar44._12_4_ + auVar41._12_4_ >> 4;
                auVar41 = pmulld(auVar40,auVar23);
                auVar44 = pmulld(auVar62,auVar21);
                iVar60 = auVar44._0_4_ + auVar41._0_4_ >> 4;
                iVar64 = auVar44._4_4_ + auVar41._4_4_ >> 4;
                iVar65 = auVar44._8_4_ + auVar41._8_4_ >> 4;
                iVar66 = auVar44._12_4_ + auVar41._12_4_ >> 4;
              }
              auVar41 = ZEXT416(uVar25);
              auVar49._0_4_ = iVar46 + iVar28 >> auVar41;
              auVar49._4_4_ = iVar52 + iVar28 >> auVar41;
              auVar49._8_4_ = iVar55 + iVar28 >> auVar41;
              auVar49._12_4_ = iVar58 + iVar28 >> auVar41;
              auVar63._0_4_ = iVar60 + iVar28 >> auVar41;
              auVar63._4_4_ = iVar64 + iVar28 >> auVar41;
              auVar63._8_4_ = iVar65 + iVar28 >> auVar41;
              auVar63._12_4_ = iVar66 + iVar28 >> auVar41;
              auVar41 = packusdw(auVar49,auVar63);
              sVar45 = auVar41._0_2_;
              sVar50 = auVar41._2_2_;
              sVar51 = auVar41._4_2_;
              sVar53 = auVar41._6_2_;
              sVar54 = auVar41._8_2_;
              sVar56 = auVar41._10_2_;
              sVar57 = auVar41._12_2_;
              sVar59 = auVar41._14_2_;
              *puVar27 = (ushort)(local_48 < sVar45) * local_48 |
                         (ushort)(local_48 >= sVar45) * sVar45;
              puVar27[1] = (ushort)(sStack_46 < sVar50) * sStack_46 |
                           (ushort)(sStack_46 >= sVar50) * sVar50;
              puVar27[2] = (ushort)(local_48 < sVar51) * local_48 |
                           (ushort)(local_48 >= sVar51) * sVar51;
              puVar27[3] = (ushort)(sStack_46 < sVar53) * sStack_46 |
                           (ushort)(sStack_46 >= sVar53) * sVar53;
              puVar27[4] = (ushort)(local_48 < sVar54) * local_48 |
                           (ushort)(local_48 >= sVar54) * sVar54;
              puVar27[5] = (ushort)(sStack_46 < sVar56) * sStack_46 |
                           (ushort)(sStack_46 >= sVar56) * sVar56;
              puVar27[6] = (ushort)(local_48 < sVar57) * local_48 |
                           (ushort)(local_48 >= sVar57) * sVar57;
              puVar27[7] = (ushort)(sStack_46 < sVar59) * sStack_46 |
                           (ushort)(sStack_46 >= sVar59) * sVar59;
            }
          }
          uVar35 = uVar35 - 1;
          puVar27 = puVar27 + dst_stride0;
          pauVar29 = (undefined1 (*) [16])(*pauVar29 + (long)src_stride * 2);
          pauVar32 = (undefined1 (*) [16])(*pauVar32 + (long)iVar3 * 2);
        } while (uVar35 != 0);
      }
      uVar33 = uVar33 + 8;
      pauVar30 = pauVar30 + 1;
      dst0 = dst0 + 8;
      pauVar36 = pauVar36 + 1;
    } while (uVar33 < (uint)w);
  }
  return;
}

Assistant:

void av1_highbd_dist_wtd_convolve_x_sse4_1(
    const uint16_t *src, int src_stride, uint16_t *dst0, int dst_stride0, int w,
    int h, const InterpFilterParams *filter_params_x, const int subpel_x_qn,
    ConvolveParams *conv_params, int bd) {
  CONV_BUF_TYPE *dst = conv_params->dst;
  int dst_stride = conv_params->dst_stride;
  const int fo_horiz = filter_params_x->taps / 2 - 1;
  const uint16_t *const src_ptr = src - fo_horiz;
  const int bits = FILTER_BITS - conv_params->round_1;

  int i, j;
  __m128i s[4], coeffs_x[4];

  const int do_average = conv_params->do_average;
  const int use_dist_wtd_comp_avg = conv_params->use_dist_wtd_comp_avg;
  const int w0 = conv_params->fwd_offset;
  const int w1 = conv_params->bck_offset;
  const __m128i wt0 = _mm_set1_epi32(w0);
  const __m128i wt1 = _mm_set1_epi32(w1);
  const __m128i zero = _mm_setzero_si128();

  const __m128i round_const_x =
      _mm_set1_epi32(((1 << conv_params->round_0) >> 1));
  const __m128i round_shift_x = _mm_cvtsi32_si128(conv_params->round_0);
  const __m128i round_shift_bits = _mm_cvtsi32_si128(bits);

  const int offset_0 =
      bd + 2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const int offset = (1 << offset_0) + (1 << (offset_0 - 1));
  const __m128i offset_const = _mm_set1_epi32(offset);
  const int rounding_shift =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const __m128i rounding_const = _mm_set1_epi32((1 << rounding_shift) >> 1);
  const __m128i clip_pixel_to_bd =
      _mm_set1_epi16(bd == 10 ? 1023 : (bd == 12 ? 4095 : 255));

  assert(bits >= 0);
  prepare_coeffs(filter_params_x, subpel_x_qn, coeffs_x);

  for (j = 0; j < w; j += 8) {
    /* Horizontal filter */
    for (i = 0; i < h; i += 1) {
      const __m128i row00 =
          _mm_loadu_si128((__m128i *)&src_ptr[i * src_stride + j]);
      const __m128i row01 =
          _mm_loadu_si128((__m128i *)&src_ptr[i * src_stride + (j + 8)]);

      // even pixels
      s[0] = _mm_alignr_epi8(row01, row00, 0);
      s[1] = _mm_alignr_epi8(row01, row00, 4);
      s[2] = _mm_alignr_epi8(row01, row00, 8);
      s[3] = _mm_alignr_epi8(row01, row00, 12);

      __m128i res_even = convolve(s, coeffs_x);
      res_even =
          _mm_sra_epi32(_mm_add_epi32(res_even, round_const_x), round_shift_x);

      // odd pixels
      s[0] = _mm_alignr_epi8(row01, row00, 2);
      s[1] = _mm_alignr_epi8(row01, row00, 6);
      s[2] = _mm_alignr_epi8(row01, row00, 10);
      s[3] = _mm_alignr_epi8(row01, row00, 14);

      __m128i res_odd = convolve(s, coeffs_x);
      res_odd =
          _mm_sra_epi32(_mm_add_epi32(res_odd, round_const_x), round_shift_x);

      res_even = _mm_sll_epi32(res_even, round_shift_bits);
      res_odd = _mm_sll_epi32(res_odd, round_shift_bits);

      __m128i res1 = _mm_unpacklo_epi32(res_even, res_odd);
      __m128i res_unsigned_lo = _mm_add_epi32(res1, offset_const);
      if (w - j < 8) {
        if (do_average) {
          const __m128i data_0 =
              _mm_loadl_epi64((__m128i *)(&dst[i * dst_stride + j]));
          const __m128i data_ref_0 = _mm_unpacklo_epi16(data_0, zero);

          const __m128i comp_avg_res = highbd_comp_avg_sse4_1(
              &data_ref_0, &res_unsigned_lo, &wt0, &wt1, use_dist_wtd_comp_avg);
          const __m128i round_result = highbd_convolve_rounding_sse2(
              &comp_avg_res, &offset_const, &rounding_const, rounding_shift);

          const __m128i res_16b = _mm_packus_epi32(round_result, round_result);
          const __m128i res_clip = _mm_min_epi16(res_16b, clip_pixel_to_bd);
          _mm_storel_epi64((__m128i *)(&dst0[i * dst_stride0 + j]), res_clip);
        } else {
          __m128i res_16b = _mm_packus_epi32(res_unsigned_lo, res_unsigned_lo);
          _mm_storel_epi64((__m128i *)&dst[i * dst_stride + j], res_16b);
        }
      } else {
        __m128i res2 = _mm_unpackhi_epi32(res_even, res_odd);
        __m128i res_unsigned_hi = _mm_add_epi32(res2, offset_const);
        if (do_average) {
          const __m128i data_0 =
              _mm_loadu_si128((__m128i *)(&dst[i * dst_stride + j]));
          const __m128i data_ref_0_lo = _mm_unpacklo_epi16(data_0, zero);
          const __m128i data_ref_0_hi = _mm_unpackhi_epi16(data_0, zero);

          const __m128i comp_avg_res_lo =
              highbd_comp_avg_sse4_1(&data_ref_0_lo, &res_unsigned_lo, &wt0,
                                     &wt1, use_dist_wtd_comp_avg);
          const __m128i comp_avg_res_hi =
              highbd_comp_avg_sse4_1(&data_ref_0_hi, &res_unsigned_hi, &wt0,
                                     &wt1, use_dist_wtd_comp_avg);

          const __m128i round_result_lo = highbd_convolve_rounding_sse2(
              &comp_avg_res_lo, &offset_const, &rounding_const, rounding_shift);
          const __m128i round_result_hi = highbd_convolve_rounding_sse2(
              &comp_avg_res_hi, &offset_const, &rounding_const, rounding_shift);

          const __m128i res_16b =
              _mm_packus_epi32(round_result_lo, round_result_hi);
          const __m128i res_clip = _mm_min_epi16(res_16b, clip_pixel_to_bd);
          _mm_store_si128((__m128i *)(&dst0[i * dst_stride0 + j]), res_clip);
        } else {
          __m128i res_16b = _mm_packus_epi32(res_unsigned_lo, res_unsigned_hi);
          _mm_store_si128((__m128i *)(&dst[i * dst_stride + j]), res_16b);
        }
      }
    }
  }
}